

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[4],kj::CappedArray<char,17ul>>
          (String *__return_storage_ptr__,kj *this,char (*params) [4],
          CappedArray<char,_17UL> *params_1)

{
  char (*value) [4];
  CappedArray<char,_17UL> *value_00;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  NoInfer<kj::CappedArray<char,_17UL>_> *local_20;
  CappedArray<char,_17UL> *params_local_1;
  char (*params_local) [4];
  
  local_20 = (NoInfer<kj::CappedArray<char,_17UL>_> *)params;
  params_local_1 = (CappedArray<char,_17UL> *)this;
  params_local = (char (*) [4])__return_storage_ptr__;
  value = ::const((char (*) [4])this);
  local_30 = toCharSequence<char_const(&)[4]>(value);
  value_00 = fwd<kj::CappedArray<char,17ul>>(local_20);
  local_40 = toCharSequence<kj::CappedArray<char,17ul>>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}